

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void dealloc_compressor_data(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  AV1_COMP *in_RDI;
  int j_1;
  int plane;
  int is_highbitdepth;
  int j;
  int i;
  int num_planes;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  TokenInfo *token_info;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int in_stack_ffffffffffffffd4;
  int local_28;
  AV1_COMP *cpi_00;
  TokenInfo *cdef_worker;
  AV1_COMMON *cm_00;
  
  cm_00 = &in_RDI->common;
  cdef_worker = &in_RDI->token_info;
  cpi_00 = (AV1_COMP *)&(in_RDI->mt_info).enc_row_mt;
  iVar1 = av1_num_planes(cm_00);
  dealloc_context_buffers_ext((MBMIExtFrameBufferInfo *)0x54402c);
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  in_RDI->tile_data = (TileDataEnc *)0x0;
  in_RDI->allocated_tiles = 0;
  *(int *)((long)&cpi_00->ppi + 4) = 0;
  *(int *)&cpi_00->ppi = 0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->enc_seg).map = (uint8_t *)0x0;
  av1_cyclic_refresh_free((CYCLIC_REFRESH *)0x5440a5);
  in_RDI->cyclic_refresh = (CYCLIC_REFRESH *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->active_map).map = (uchar *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  in_RDI->ssim_rdmult_scaling_factors = (double *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  in_RDI->tpl_rdmult_scaling_factors = (double *)0x0;
  release_obmc_buffers((OBMCBuffer *)0x544130);
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->td).mv_costs_alloc = (MvCosts *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->td).dv_costs_alloc = (IntraBCMVCosts *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->td).mb.sb_stats_cache = (SB_FIRST_PASS_STATS *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->td).mb.sb_fp_stats = (SB_FIRST_PASS_STATS *)0x0;
  av1_free_pc_tree_recursive
            ((PC_TREE *)cm_00,(int)((ulong)cdef_worker >> 0x20),(int)cdef_worker,
             (int)((ulong)cpi_00 >> 0x20),(PARTITION_SEARCH_TYPE)((ulong)cpi_00 >> 0x18));
  (in_RDI->td).pc_root = (PC_TREE *)0x0;
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < 2;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      (in_RDI->td).mb.intrabc_hash_info.hash_value_buffer[local_28][in_stack_ffffffffffffffd4] =
           (uint32_t *)0x0;
    }
  }
  av1_hash_table_destroy((hash_table *)0x54429c);
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  cm_00->tpl_mvs = (TPL_MV_REF *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->td).pixel_gradient_info = (PixelLevelGradientInfo *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->td).src_var_info_of_4x4_sub_blocks = (Block4x4VarInfo *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->td).vt64x64 = (VP64x64 *)0x0;
  av1_free_pmc((PICK_MODE_CONTEXT *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
  (in_RDI->td).firstpass_ctx = (PICK_MODE_CONTEXT *)0x0;
  iVar3 = (in_RDI->tf_ctx).is_highbitdepth;
  tf_dealloc_data((TemporalFilterData *)CONCAT44(in_stack_ffffffffffffffd4,iVar3),
                  in_stack_ffffffffffffffcc);
  tpl_dealloc_temp_buffers((TplBuffers *)0x544388);
  gm_dealloc_data((GlobalMotionData *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  av1_cdef_dealloc_data((CdefSearchCtx *)0x5443b1);
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  in_RDI->cdef_search_ctx = (CdefSearchCtx *)0x0;
  av1_dealloc_mb_data((macroblock *)CONCAT44(in_stack_ffffffffffffffd4,iVar3),
                      in_stack_ffffffffffffffcc);
  av1_dealloc_mb_wiener_var_pred_buf((ThreadData_conflict *)0x5443f8);
  av1_free_txb_buf((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  av1_free_context_buffers((AV1_COMMON *)0x54440c);
  aom_free_frame_buffer
            ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  av1_free_restoration_buffers((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  av1_free_firstpass_data((FirstPassData *)0x544438);
  iVar2 = is_stat_generation_stage(in_RDI);
  if (iVar2 == 0) {
    av1_free_cdef_buffers(cm_00,(AV1CdefWorkerData **)cdef_worker,(AV1CdefSync *)cpi_00);
  }
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
    (in_RDI->pick_lr_ctxt).rusi[iVar2] = (RestUnitSearchInfo *)0x0;
  }
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  (in_RDI->pick_lr_ctxt).dgd_avg = (int16_t *)0x0;
  aom_free_frame_buffer((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  aom_free_frame_buffer((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  aom_free_frame_buffer((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  aom_free_frame_buffer((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  aom_free_frame_buffer((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  free_token_info((TokenInfo *)0x54454a);
  av1_free_shared_coeff_buffer((PC_TREE_SHARED_BUFFERS *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  av1_free_sms_tree((ThreadData_conflict *)0x544573);
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  release_compound_type_rd_buffers((CompoundTypeRdBuffers *)0x54459c);
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  }
  if (in_RDI->denoise_and_model != (aom_denoise_and_model_t *)0x0) {
    aom_denoise_and_model_free((aom_denoise_and_model_t *)CONCAT44(in_stack_ffffffffffffffd4,iVar3))
    ;
    in_RDI->denoise_and_model = (aom_denoise_and_model_t *)0x0;
  }
  if (in_RDI->film_grain_table != (aom_film_grain_table_t *)0x0) {
    aom_film_grain_table_free((aom_film_grain_table_t *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
    in_RDI->film_grain_table = (aom_film_grain_table_t *)0x0;
  }
  if (in_RDI->ppi->use_svc != 0) {
    av1_free_svc_cyclic_refresh(cpi_00);
  }
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  (in_RDI->svc).layer_context = (LAYER_CONTEXT *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  in_RDI->consec_zero_mv = (uint8_t *)0x0;
  in_RDI->consec_zero_mv_alloc_size = 0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  in_RDI->src_sad_blk_64x64 = (uint64_t *)0x0;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  in_RDI->mb_weber_stats = (WeberStats *)0x0;
  if ((in_RDI->oxcf).enable_rate_guide_deltaq != 0) {
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
    in_RDI->prep_rate_estimates = (int *)0x0;
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
    in_RDI->ext_rate_distribution = (double *)0x0;
  }
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
  in_RDI->mb_delta_q = (int *)0x0;
  return;
}

Assistant:

static inline void dealloc_compressor_data(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  TokenInfo *token_info = &cpi->token_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  const int num_planes = av1_num_planes(cm);
  dealloc_context_buffers_ext(&cpi->mbmi_ext_info);

  aom_free(cpi->tile_data);
  cpi->tile_data = NULL;
  cpi->allocated_tiles = 0;
  enc_row_mt->allocated_tile_cols = 0;
  enc_row_mt->allocated_tile_rows = 0;

  // Delete sementation map
  aom_free(cpi->enc_seg.map);
  cpi->enc_seg.map = NULL;

  av1_cyclic_refresh_free(cpi->cyclic_refresh);
  cpi->cyclic_refresh = NULL;

  aom_free(cpi->active_map.map);
  cpi->active_map.map = NULL;

  aom_free(cpi->ssim_rdmult_scaling_factors);
  cpi->ssim_rdmult_scaling_factors = NULL;

  aom_free(cpi->tpl_rdmult_scaling_factors);
  cpi->tpl_rdmult_scaling_factors = NULL;

#if CONFIG_TUNE_VMAF
  aom_free(cpi->vmaf_info.rdmult_scaling_factors);
  cpi->vmaf_info.rdmult_scaling_factors = NULL;
  aom_close_vmaf_model(cpi->vmaf_info.vmaf_model);
#endif

#if CONFIG_TUNE_BUTTERAUGLI
  aom_free(cpi->butteraugli_info.rdmult_scaling_factors);
  cpi->butteraugli_info.rdmult_scaling_factors = NULL;
  aom_free_frame_buffer(&cpi->butteraugli_info.source);
  aom_free_frame_buffer(&cpi->butteraugli_info.resized_source);
#endif

#if CONFIG_SALIENCY_MAP
  aom_free(cpi->saliency_map);
  aom_free(cpi->sm_scaling_factor);
#endif

  release_obmc_buffers(&cpi->td.mb.obmc_buffer);

  aom_free(cpi->td.mv_costs_alloc);
  cpi->td.mv_costs_alloc = NULL;
  aom_free(cpi->td.dv_costs_alloc);
  cpi->td.dv_costs_alloc = NULL;

  aom_free(cpi->td.mb.sb_stats_cache);
  cpi->td.mb.sb_stats_cache = NULL;

  aom_free(cpi->td.mb.sb_fp_stats);
  cpi->td.mb.sb_fp_stats = NULL;

#if CONFIG_PARTITION_SEARCH_ORDER
  aom_free(cpi->td.mb.rdcost);
  cpi->td.mb.rdcost = NULL;
#endif

  av1_free_pc_tree_recursive(cpi->td.pc_root, num_planes, 0, 0,
                             cpi->sf.part_sf.partition_search_type);
  cpi->td.pc_root = NULL;

  for (int i = 0; i < 2; i++)
    for (int j = 0; j < 2; j++) {
      aom_free(cpi->td.mb.intrabc_hash_info.hash_value_buffer[i][j]);
      cpi->td.mb.intrabc_hash_info.hash_value_buffer[i][j] = NULL;
    }

  av1_hash_table_destroy(&cpi->td.mb.intrabc_hash_info.intrabc_hash_table);

  aom_free(cm->tpl_mvs);
  cm->tpl_mvs = NULL;

  aom_free(cpi->td.pixel_gradient_info);
  cpi->td.pixel_gradient_info = NULL;

  aom_free(cpi->td.src_var_info_of_4x4_sub_blocks);
  cpi->td.src_var_info_of_4x4_sub_blocks = NULL;

  aom_free(cpi->td.vt64x64);
  cpi->td.vt64x64 = NULL;

  av1_free_pmc(cpi->td.firstpass_ctx, num_planes);
  cpi->td.firstpass_ctx = NULL;

  const int is_highbitdepth = cpi->tf_ctx.is_highbitdepth;
  // This call ensures that the buffers allocated by tf_alloc_and_reset_data()
  // in av1_temporal_filter() for single-threaded encode are freed in case an
  // error is encountered during temporal filtering (due to early termination
  // tf_dealloc_data() in av1_temporal_filter() would not be invoked).
  tf_dealloc_data(&cpi->td.tf_data, is_highbitdepth);

  // This call ensures that tpl_tmp_buffers for single-threaded encode are freed
  // in case of an error during tpl.
  tpl_dealloc_temp_buffers(&cpi->td.tpl_tmp_buffers);

  // This call ensures that the global motion (gm) data buffers for
  // single-threaded encode are freed in case of an error during gm.
  gm_dealloc_data(&cpi->td.gm_data);

  // This call ensures that CDEF search context buffers are deallocated in case
  // of an error during cdef search.
  av1_cdef_dealloc_data(cpi->cdef_search_ctx);
  aom_free(cpi->cdef_search_ctx);
  cpi->cdef_search_ctx = NULL;

  av1_dealloc_mb_data(&cpi->td.mb, num_planes);

  av1_dealloc_mb_wiener_var_pred_buf(&cpi->td);

  av1_free_txb_buf(cpi);
  av1_free_context_buffers(cm);

  aom_free_frame_buffer(&cpi->last_frame_uf);
#if !CONFIG_REALTIME_ONLY
  av1_free_restoration_buffers(cm);
  av1_free_firstpass_data(&cpi->firstpass_data);
#endif

  if (!is_stat_generation_stage(cpi)) {
    av1_free_cdef_buffers(cm, &cpi->ppi->p_mt_info.cdef_worker,
                          &cpi->mt_info.cdef_sync);
  }

  for (int plane = 0; plane < num_planes; plane++) {
    aom_free(cpi->pick_lr_ctxt.rusi[plane]);
    cpi->pick_lr_ctxt.rusi[plane] = NULL;
  }
  aom_free(cpi->pick_lr_ctxt.dgd_avg);
  cpi->pick_lr_ctxt.dgd_avg = NULL;

  aom_free_frame_buffer(&cpi->trial_frame_rst);
  aom_free_frame_buffer(&cpi->scaled_source);
  aom_free_frame_buffer(&cpi->scaled_last_source);
  aom_free_frame_buffer(&cpi->orig_source);
  aom_free_frame_buffer(&cpi->svc.source_last_TL0);

  free_token_info(token_info);

  av1_free_shared_coeff_buffer(&cpi->td.shared_coeff_buf);
  av1_free_sms_tree(&cpi->td);

  aom_free(cpi->td.mb.palette_buffer);
  release_compound_type_rd_buffers(&cpi->td.mb.comp_rd_buffer);
  aom_free(cpi->td.mb.tmp_conv_dst);
  for (int j = 0; j < 2; ++j) {
    aom_free(cpi->td.mb.tmp_pred_bufs[j]);
  }

#if CONFIG_DENOISE && !CONFIG_REALTIME_ONLY
  if (cpi->denoise_and_model) {
    aom_denoise_and_model_free(cpi->denoise_and_model);
    cpi->denoise_and_model = NULL;
  }
#endif
#if !CONFIG_REALTIME_ONLY
  if (cpi->film_grain_table) {
    aom_film_grain_table_free(cpi->film_grain_table);
    aom_free(cpi->film_grain_table);
    cpi->film_grain_table = NULL;
  }
#endif

  if (cpi->ppi->use_svc) av1_free_svc_cyclic_refresh(cpi);
  aom_free(cpi->svc.layer_context);
  cpi->svc.layer_context = NULL;

  aom_free(cpi->consec_zero_mv);
  cpi->consec_zero_mv = NULL;
  cpi->consec_zero_mv_alloc_size = 0;

  aom_free(cpi->src_sad_blk_64x64);
  cpi->src_sad_blk_64x64 = NULL;

  aom_free(cpi->mb_weber_stats);
  cpi->mb_weber_stats = NULL;

  if (cpi->oxcf.enable_rate_guide_deltaq) {
    aom_free(cpi->prep_rate_estimates);
    cpi->prep_rate_estimates = NULL;

    aom_free(cpi->ext_rate_distribution);
    cpi->ext_rate_distribution = NULL;
  }

  aom_free(cpi->mb_delta_q);
  cpi->mb_delta_q = NULL;
}